

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# units.cpp
# Opt level: O1

precise_unit units::default_unit(string *unit_type)

{
  char cVar1;
  size_type sVar2;
  pointer pcVar3;
  char *pcVar4;
  precise_unit pVar5;
  int iVar6;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  _Var7;
  const_iterator cVar8;
  long lVar9;
  ulong uVar10;
  size_type sVar11;
  bool bVar12;
  double dVar13;
  precise_unit pVar14;
  precise_unit pVar15;
  precise_unit tunit;
  undefined1 local_208 [16];
  long local_1f8 [2];
  string local_1e8;
  string local_1c8;
  string local_1a8;
  string local_188;
  string local_168;
  string local_148;
  string local_128;
  string local_108;
  string local_e8;
  string local_c8;
  string local_a8;
  string local_88;
  string local_68;
  string local_48;
  
  if ((default_unit(std::__cxx11::string)::measurement_types_abi_cxx11_ == '\0') &&
     (iVar6 = __cxa_guard_acquire(&default_unit(std::__cxx11::string)::measurement_types_abi_cxx11_)
     , iVar6 != 0)) {
    loadDefinedMeasurementTypes_abi_cxx11_();
    __cxa_atexit(std::
                 unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_units::precise_unit,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_units::precise_unit>_>_>
                 ::~unordered_map,&default_unit(std::__cxx11::string)::measurement_types_abi_cxx11_,
                 &__dso_handle);
    __cxa_guard_release(&default_unit(std::__cxx11::string)::measurement_types_abi_cxx11_);
  }
  sVar2 = unit_type->_M_string_length;
  if (sVar2 != 1) goto switchD_0016cd9f_caseD_4b;
  cVar1 = *(unit_type->_M_dataplus)._M_p;
  switch(cVar1) {
  case 'I':
    pVar14.base_units_ = (unit_data)0x800;
    pVar14.commodity_ = 0;
    pVar14.multiplier_ = 1.0;
    break;
  case 'J':
    pVar14.base_units_ = (unit_data)0x4000;
    pVar14.commodity_ = 0;
    pVar14.multiplier_ = 1.0;
    break;
  case 'K':
  case 'O':
  case 'P':
  case 'Q':
  case 'R':
  case 'S':
    goto switchD_0016cd9f_caseD_4b;
  case 'L':
    pVar14.base_units_ = (unit_data)0x1;
    pVar14.commodity_ = 0;
    pVar14.multiplier_ = 1.0;
    break;
  case 'M':
    pVar14.base_units_ = (unit_data)0x100;
    pVar14.commodity_ = 0;
    pVar14.multiplier_ = 1.0;
    break;
  case 'N':
    pVar14.base_units_ = (unit_data)0x80000;
    pVar14.commodity_ = 0;
    pVar14.multiplier_ = 1.0;
    break;
  case 'T':
    pVar14.base_units_ = (unit_data)0x10;
    pVar14.commodity_ = 0;
    pVar14.multiplier_ = 1.0;
    break;
  default:
    if (cVar1 == 'l') {
      return (precise_unit)ZEXT816(0x3ff0000000000000);
    }
    if (cVar1 == -0x38) {
      pVar15.base_units_ = (unit_data)0x10000;
      pVar15.commodity_ = 0;
      pVar15.multiplier_ = 1.0;
      return pVar15;
    }
switchD_0016cd9f_caseD_4b:
    if (sVar2 != 0) {
      pcVar3 = (unit_type->_M_dataplus)._M_p;
      sVar11 = 0;
      do {
        iVar6 = tolower((int)pcVar3[sVar11]);
        pcVar3[sVar11] = (char)iVar6;
        sVar11 = sVar11 + 1;
      } while (sVar2 != sVar11);
    }
    _Var7._M_current = (unit_type->_M_dataplus)._M_p;
    local_208[0] = 0x20;
    _Var7 = std::
            __remove_if<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,__gnu_cxx::__ops::_Iter_equals_val<char_const>>
                      (_Var7,_Var7._M_current + unit_type->_M_string_length,
                       (_Iter_equals_val<const_char>)local_208);
    unit_type->_M_string_length = (long)_Var7._M_current - (long)(unit_type->_M_dataplus)._M_p;
    *_Var7._M_current = '\0';
    cVar8 = std::
            _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_units::precise_unit>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_units::precise_unit>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
            ::find(&default_unit(std::__cxx11::string)::measurement_types_abi_cxx11_._M_h,unit_type)
    ;
    if (cVar8.
        super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_units::precise_unit>,_true>
        ._M_cur != (__node_type *)0x0) {
      return *(precise_unit *)
              ((long)cVar8.
                     super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_units::precise_unit>,_true>
                     ._M_cur + 0x28);
    }
    pcVar4 = (unit_type->_M_dataplus)._M_p;
    if (*pcVar4 == '{') {
      if (pcVar4[unit_type->_M_string_length - 1] != '}') goto LAB_0016ceb1;
LAB_0016ce57:
      std::__cxx11::string::pop_back();
      std::__cxx11::string::substr((ulong)&local_48,(ulong)unit_type);
      pVar14 = default_unit(&local_48);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_48._M_dataplus._M_p == &local_48.field_2) {
        return pVar14;
      }
    }
    else {
      if ((*pcVar4 == '[') && (pcVar4[unit_type->_M_string_length - 1] == ']')) goto LAB_0016ce57;
LAB_0016ceb1:
      iVar6 = std::__cxx11::string::compare((ulong)unit_type,0,(char *)0xa);
      if (iVar6 == 0) {
        std::__cxx11::string::substr((ulong)&local_68,(ulong)unit_type);
        pVar14 = default_unit(&local_68);
        local_48.field_2._M_allocated_capacity = local_68.field_2._M_allocated_capacity;
        local_48._M_dataplus._M_p = local_68._M_dataplus._M_p;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_68._M_dataplus._M_p == &local_68.field_2) {
          return pVar14;
        }
      }
      else {
        iVar6 = std::__cxx11::string::compare((ulong)unit_type,0,(char *)0x9);
        if (iVar6 == 0) {
          std::__cxx11::string::substr((ulong)&local_88,(ulong)unit_type);
          pVar14 = default_unit(&local_88);
          local_48.field_2._M_allocated_capacity = local_88.field_2._M_allocated_capacity;
          local_48._M_dataplus._M_p = local_88._M_dataplus._M_p;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_88._M_dataplus._M_p == &local_88.field_2) {
            return pVar14;
          }
        }
        else {
          iVar6 = std::__cxx11::string::compare((ulong)unit_type,0,(char *)0x6);
          if (iVar6 == 0) {
            std::__cxx11::string::substr((ulong)&local_a8,(ulong)unit_type);
            local_208 = (undefined1  [16])default_unit(&local_a8);
            pVar14 = precise_unit::operator/((precise_unit *)local_208,(precise_unit *)precise::s);
            local_48.field_2._M_allocated_capacity = local_a8.field_2._M_allocated_capacity;
            local_48._M_dataplus._M_p = local_a8._M_dataplus._M_p;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_a8._M_dataplus._M_p == &local_a8.field_2) {
              return pVar14;
            }
          }
          else {
            lVar9 = std::__cxx11::string::rfind((char *)unit_type,0x1815ae,0xffffffffffffffff);
            if (lVar9 == -1) {
              lVar9 = std::__cxx11::string::find_first_of((char *)unit_type,0x1815b8,0);
              if (lVar9 == -1) {
                iVar6 = std::__cxx11::string::compare((ulong)unit_type,0,(char *)0x3);
                if (iVar6 == 0) {
                  std::__cxx11::string::substr((ulong)&local_108,(ulong)unit_type);
                  local_208 = (undefined1  [16])default_unit(&local_108);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_108._M_dataplus._M_p != &local_108.field_2) {
                    operator_delete(local_108._M_dataplus._M_p,
                                    local_108.field_2._M_allocated_capacity + 1);
                  }
                  if ((!NAN((double)local_208._0_8_)) &&
                     (bVar12 = (unit_data)local_208._8_4_ != (unit_data)0xfa94a488, bVar12)) {
                    pVar15 = precise_unit::inv((precise_unit *)local_208);
                    return pVar15;
                  }
                }
                local_208._0_8_ = local_1f8;
                std::__cxx11::string::_M_construct<char_const*>((string *)local_208,"rto","");
                uVar10 = (long)unit_type->_M_string_length - local_208._8_8_;
                if ((string *)unit_type->_M_string_length < (ulong)local_208._8_8_ || uVar10 == 0) {
                  bVar12 = false;
                }
                else {
                  iVar6 = std::__cxx11::string::compare
                                    ((ulong)unit_type,uVar10,(string *)local_208._8_8_);
                  bVar12 = iVar6 == 0;
                }
                if ((long *)local_208._0_8_ != local_1f8) {
                  operator_delete((void *)local_208._0_8_,local_1f8[0] + 1);
                }
                if (bVar12) {
LAB_0016d2a5:
                  return (precise_unit)ZEXT816(0x3ff0000000000000);
                }
                local_208._0_8_ = local_1f8;
                std::__cxx11::string::_M_construct<char_const*>((string *)local_208,"fr","");
                uVar10 = (long)unit_type->_M_string_length - local_208._8_8_;
                if ((string *)unit_type->_M_string_length < (ulong)local_208._8_8_ || uVar10 == 0) {
                  bVar12 = false;
                }
                else {
                  iVar6 = std::__cxx11::string::compare
                                    ((ulong)unit_type,uVar10,(string *)local_208._8_8_);
                  bVar12 = iVar6 == 0;
                }
                if ((long *)local_208._0_8_ != local_1f8) {
                  operator_delete((void *)local_208._0_8_,local_1f8[0] + 1);
                }
                if (bVar12) goto LAB_0016d2a5;
                local_208._0_8_ = local_1f8;
                std::__cxx11::string::_M_construct<char_const*>((string *)local_208,"quantity","");
                uVar10 = (long)unit_type->_M_string_length - local_208._8_8_;
                if ((string *)unit_type->_M_string_length < (ulong)local_208._8_8_ || uVar10 == 0) {
                  bVar12 = false;
                }
                else {
                  iVar6 = std::__cxx11::string::compare
                                    ((ulong)unit_type,uVar10,(string *)local_208._8_8_);
                  bVar12 = iVar6 == 0;
                }
                if ((long *)local_208._0_8_ != local_1f8) {
                  operator_delete((void *)local_208._0_8_,local_1f8[0] + 1);
                }
                if (bVar12) {
                  std::__cxx11::string::substr((ulong)&local_128,(ulong)unit_type);
                  pVar14 = default_unit(&local_128);
                  local_48.field_2._M_allocated_capacity = local_128.field_2._M_allocated_capacity;
                  local_48._M_dataplus._M_p = local_128._M_dataplus._M_p;
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_128._M_dataplus._M_p == &local_128.field_2) {
                    return pVar14;
                  }
                }
                else {
                  local_208._0_8_ = local_1f8;
                  std::__cxx11::string::_M_construct<char_const*>
                            ((string *)local_208,"quantities","");
                  uVar10 = (long)unit_type->_M_string_length - local_208._8_8_;
                  if ((string *)unit_type->_M_string_length < (ulong)local_208._8_8_ || uVar10 == 0)
                  {
                    bVar12 = false;
                  }
                  else {
                    iVar6 = std::__cxx11::string::compare
                                      ((ulong)unit_type,uVar10,(string *)local_208._8_8_);
                    bVar12 = iVar6 == 0;
                  }
                  if ((long *)local_208._0_8_ != local_1f8) {
                    operator_delete((void *)local_208._0_8_,local_1f8[0] + 1);
                  }
                  if (bVar12) {
                    std::__cxx11::string::substr((ulong)&local_148,(ulong)unit_type);
                    pVar14 = default_unit(&local_148);
                    local_48.field_2._M_allocated_capacity = local_148.field_2._M_allocated_capacity
                    ;
                    local_48._M_dataplus._M_p = local_148._M_dataplus._M_p;
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_148._M_dataplus._M_p == &local_148.field_2) {
                      return pVar14;
                    }
                  }
                  else {
                    local_208._0_8_ = local_1f8;
                    std::__cxx11::string::_M_construct<char_const*>
                              ((string *)local_208,"measure","");
                    uVar10 = (long)unit_type->_M_string_length - local_208._8_8_;
                    if ((string *)unit_type->_M_string_length < (ulong)local_208._8_8_ ||
                        uVar10 == 0) {
                      bVar12 = false;
                    }
                    else {
                      iVar6 = std::__cxx11::string::compare
                                        ((ulong)unit_type,uVar10,(string *)local_208._8_8_);
                      bVar12 = iVar6 == 0;
                    }
                    if ((long *)local_208._0_8_ != local_1f8) {
                      operator_delete((void *)local_208._0_8_,local_1f8[0] + 1);
                    }
                    if (bVar12) {
                      std::__cxx11::string::substr((ulong)&local_168,(ulong)unit_type);
                      pVar14 = default_unit(&local_168);
                      local_48.field_2._M_allocated_capacity =
                           local_168.field_2._M_allocated_capacity;
                      local_48._M_dataplus._M_p = local_168._M_dataplus._M_p;
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_168._M_dataplus._M_p == &local_168.field_2) {
                        return pVar14;
                      }
                    }
                    else {
                      local_208._0_8_ = local_1f8;
                      std::__cxx11::string::_M_construct<char_const*>((string *)local_208,"size","")
                      ;
                      uVar10 = (long)unit_type->_M_string_length - local_208._8_8_;
                      if ((string *)unit_type->_M_string_length < (ulong)local_208._8_8_ ||
                          uVar10 == 0) {
                        bVar12 = false;
                      }
                      else {
                        iVar6 = std::__cxx11::string::compare
                                          ((ulong)unit_type,uVar10,(string *)local_208._8_8_);
                        bVar12 = iVar6 == 0;
                      }
                      if ((long *)local_208._0_8_ != local_1f8) {
                        operator_delete((void *)local_208._0_8_,local_1f8[0] + 1);
                      }
                      if (bVar12) {
                        std::__cxx11::string::substr((ulong)&local_188,(ulong)unit_type);
                        pVar14 = default_unit(&local_188);
                        local_48.field_2._M_allocated_capacity =
                             local_188.field_2._M_allocated_capacity;
                        local_48._M_dataplus._M_p = local_188._M_dataplus._M_p;
                        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)local_188._M_dataplus._M_p == &local_188.field_2) {
                          return pVar14;
                        }
                      }
                      else if ((unit_type->_M_string_length < 2) ||
                              ((unit_type->_M_dataplus)._M_p[unit_type->_M_string_length - 1] != 's'
                              )) {
                        local_208._0_8_ = local_1f8;
                        std::__cxx11::string::_M_construct<char_const*>
                                  ((string *)local_208,"rate","");
                        uVar10 = (long)unit_type->_M_string_length - local_208._8_8_;
                        if ((string *)unit_type->_M_string_length < (ulong)local_208._8_8_ ||
                            uVar10 == 0) {
                          bVar12 = false;
                        }
                        else {
                          iVar6 = std::__cxx11::string::compare
                                            ((ulong)unit_type,uVar10,(string *)local_208._8_8_);
                          bVar12 = iVar6 == 0;
                        }
                        if ((long *)local_208._0_8_ != local_1f8) {
                          operator_delete((void *)local_208._0_8_,local_1f8[0] + 1);
                        }
                        if (!bVar12) {
                          pcVar3 = (unit_type->_M_dataplus)._M_p;
                          local_1e8._M_dataplus._M_p = (pointer)&local_1e8.field_2;
                          std::__cxx11::string::_M_construct<char*>
                                    ((string *)&local_1e8,pcVar3,
                                     pcVar3 + unit_type->_M_string_length);
                          pVar15 = unit_from_string(&local_1e8,0x8000000);
                          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                               *)local_1e8._M_dataplus._M_p != &local_1e8.field_2) {
                            operator_delete(local_1e8._M_dataplus._M_p,
                                            local_1e8.field_2._M_allocated_capacity + 1);
                          }
                          uVar10 = pVar15._8_8_ & 0xffffffff;
                          if (uVar10 == 0xfa94a488 && NAN(pVar15.multiplier_)) {
                            dVar13 = NAN;
                            uVar10 = 0xfa94a488;
                          }
                          else {
                            dVar13 = 1.0;
                          }
                          pVar5.base_units_ = (unit_data)(int)uVar10;
                          pVar5.commodity_ = (int)(uVar10 >> 0x20);
                          pVar5.multiplier_ = dVar13;
                          return pVar5;
                        }
                        std::__cxx11::string::substr((ulong)&local_1a8,(ulong)unit_type);
                        local_208 = (undefined1  [16])default_unit(&local_1a8);
                        pVar14 = precise_unit::operator/
                                           ((precise_unit *)local_208,(precise_unit *)precise::s);
                        local_48.field_2._M_allocated_capacity =
                             local_1a8.field_2._M_allocated_capacity;
                        local_48._M_dataplus._M_p = local_1a8._M_dataplus._M_p;
                        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)local_1a8._M_dataplus._M_p == &local_1a8.field_2) {
                          return pVar14;
                        }
                      }
                      else {
                        std::__cxx11::string::pop_back();
                        pcVar3 = (unit_type->_M_dataplus)._M_p;
                        local_1c8._M_dataplus._M_p = (pointer)&local_1c8.field_2;
                        std::__cxx11::string::_M_construct<char*>
                                  ((string *)&local_1c8,pcVar3,pcVar3 + unit_type->_M_string_length)
                        ;
                        pVar14 = default_unit(&local_1c8);
                        local_48.field_2._M_allocated_capacity =
                             local_1c8.field_2._M_allocated_capacity;
                        local_48._M_dataplus._M_p = local_1c8._M_dataplus._M_p;
                        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)local_1c8._M_dataplus._M_p == &local_1c8.field_2) {
                          return pVar14;
                        }
                      }
                    }
                  }
                }
              }
              else {
                std::__cxx11::string::substr((ulong)&local_e8,(ulong)unit_type);
                pVar14 = default_unit(&local_e8);
                local_48.field_2._M_allocated_capacity = local_e8.field_2._M_allocated_capacity;
                local_48._M_dataplus._M_p = local_e8._M_dataplus._M_p;
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_e8._M_dataplus._M_p == &local_e8.field_2) {
                  return pVar14;
                }
              }
            }
            else {
              std::__cxx11::string::substr((ulong)&local_c8,(ulong)unit_type);
              pVar14 = default_unit(&local_c8);
              local_48.field_2._M_allocated_capacity = local_c8.field_2._M_allocated_capacity;
              local_48._M_dataplus._M_p = local_c8._M_dataplus._M_p;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_c8._M_dataplus._M_p == &local_c8.field_2) {
                return pVar14;
              }
            }
          }
        }
      }
    }
    operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
  }
  return pVar14;
}

Assistant:

precise_unit default_unit(std::string unit_type)
{
    static const smap measurement_types = loadDefinedMeasurementTypes();

    if (unit_type.size() == 1) {
        switch (unit_type[0]) {
            case 'L':
                return precise::m;
            case 'M':
                return precise::kg;
            case 'T':
                return precise::second;
            case '\xC8':
                return precise::Kelvin;
            case 'I':
                return precise::A;
            case 'N':
                return precise::mol;
            case 'J':
                return precise::cd;
            case 'l':
                return precise::one;
        }
    }
    std::transform(
        unit_type.begin(), unit_type.end(), unit_type.begin(), ::tolower);
    unit_type.erase(
        std::remove(unit_type.begin(), unit_type.end(), ' '), unit_type.end());
    auto fnd = measurement_types.find(unit_type);
    if (fnd != measurement_types.end()) {
        return fnd->second;
    }
    if ((unit_type.front() == '[' && unit_type.back() == ']') ||
        (unit_type.front() == '{' && unit_type.back() == '}')) {
        unit_type.pop_back();
        return default_unit(unit_type.substr(1));
    }
    if (unit_type.compare(0, 10, "quantityof") == 0) {
        return default_unit(unit_type.substr(10));
    }
    if (unit_type.compare(0, 9, "measureof") == 0) {
        return default_unit(unit_type.substr(9));
    }
    if (unit_type.compare(0, 6, "rateof") == 0) {
        return default_unit(unit_type.substr(6)) / precise::s;
    }
    auto fof = unit_type.rfind("of");
    if (fof != std::string::npos) {
        return default_unit(unit_type.substr(0, fof));
    }
    fof = unit_type.find_first_of("([{");
    if (fof != std::string::npos) {
        return default_unit(unit_type.substr(0, fof));
    }
    if (unit_type.compare(0, 3, "inv") == 0) {
        auto tunit = default_unit(unit_type.substr(3));
        if (!is_error(tunit)) {
            return tunit.inv();
        }
    }
    if (ends_with(unit_type, "rto")) {
        // ratio of some kind
        return precise::one;
    }
    if (ends_with(unit_type, "fr")) {
        // ratio of some kind
        return precise::one;
    }
    if (ends_with(unit_type, "quantity")) {
        return default_unit(
            unit_type.substr(0, unit_type.size() - strlen("quantity")));
    }
    if (ends_with(unit_type, "quantities")) {
        return default_unit(
            unit_type.substr(0, unit_type.size() - strlen("quantities")));
    }
    if (ends_with(unit_type, "measure")) {
        return default_unit(
            unit_type.substr(0, unit_type.size() - strlen("measure")));
    }
    if (ends_with(unit_type, "size")) {
        return default_unit(
            unit_type.substr(0, unit_type.size() - strlen("size")));
    }
    if (unit_type.back() == 's' && unit_type.size() > 1) {
        unit_type.pop_back();
        return default_unit(unit_type);
    }
    if (ends_with(unit_type, "rate")) {
        return default_unit(
                   unit_type.substr(0, unit_type.size() - strlen("rate"))) /
            precise::s;
    }
    auto retunit = unit_from_string(unit_type, no_default_units);
    if (is_valid(retunit)) {
        return precise_unit(retunit.base_units());
    }
    return precise::invalid;
}